

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iStack_44;
  uchar firstChar;
  int isText;
  int N;
  int typeNeedle;
  int typeHaystack;
  int nNeedle;
  int nHaystack;
  uchar *zNeedle;
  uchar *zHaystack;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iStack_44 = 1;
  iVar3 = sqlite3_value_type(*argv);
  iVar4 = sqlite3_value_type(argv[1]);
  if ((iVar3 != 5) && (iVar4 != 5)) {
    typeHaystack = sqlite3_value_bytes(*argv);
    iVar5 = sqlite3_value_bytes(argv[1]);
    if (0 < iVar5) {
      if ((iVar3 == 4) && (iVar4 == 4)) {
        zNeedle = (uchar *)sqlite3_value_blob(*argv);
        _nNeedle = (uchar *)sqlite3_value_blob(argv[1]);
        bVar2 = false;
      }
      else {
        zNeedle = sqlite3_value_text(*argv);
        _nNeedle = sqlite3_value_text(argv[1]);
        bVar2 = true;
      }
      if (_nNeedle == (uchar *)0x0) {
        return;
      }
      if ((typeHaystack != 0) && (zNeedle == (uchar *)0x0)) {
        return;
      }
      uVar1 = *_nNeedle;
      while( true ) {
        bVar6 = false;
        if ((iVar5 <= typeHaystack) && (bVar6 = true, *zNeedle == uVar1)) {
          iVar3 = memcmp(zNeedle,_nNeedle,(long)iVar5);
          bVar6 = iVar3 != 0;
        }
        if (!bVar6) break;
        iStack_44 = iStack_44 + 1;
        do {
          typeHaystack = typeHaystack + -1;
          zNeedle = zNeedle + 1;
          bVar6 = false;
          if (bVar2) {
            bVar6 = (*zNeedle & 0xc0) == 0x80;
          }
        } while (bVar6);
      }
      if (typeHaystack < iVar5) {
        iStack_44 = 0;
      }
    }
    sqlite3_result_int(context,iStack_44);
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}